

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O1

void __thiscall cnn::RmsPropTrainer::update(RmsPropTrainer *this,real scale)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Model *pMVar5;
  undefined8 *puVar6;
  long lVar7;
  Parameters *this_00;
  pointer pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  LookupParameters *this_01;
  pointer pTVar12;
  pointer pTVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  int iVar22;
  uint uVar23;
  size_type __new_size;
  Index size;
  ulong uVar24;
  _Hash_node_base *p_Var25;
  ulong uVar26;
  undefined8 *puVar27;
  Index index_1;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  RmsPropTrainer *pRVar31;
  Index index_2;
  ulong uVar32;
  int iVar33;
  uint uVar34;
  float fVar35;
  float fVar36;
  scalar_sum_op<float,_float> local_d9;
  RmsPropTrainer *local_d8;
  float local_d0;
  real local_cc;
  ulong local_c8;
  _Hash_node_base *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined8 *local_98;
  undefined8 *local_90;
  float *local_88;
  ulong local_80;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  local_68;
  undefined1 local_48 [16];
  
  local_d8 = this;
  local_cc = scale;
  if (this->shadow_params_allocated == false) {
    pMVar5 = (this->super_Trainer).model;
    std::vector<float,_std::allocator<float>_>::resize
              (&this->hg,*(long *)(pMVar5 + 0x20) - *(long *)(pMVar5 + 0x18) >> 3);
    pMVar5 = (this->super_Trainer).model;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&this->hlg,*(long *)(pMVar5 + 0x38) - *(long *)(pMVar5 + 0x30) >> 3);
    pMVar5 = (this->super_Trainer).model;
    puVar27 = *(undefined8 **)(pMVar5 + 0x30);
    puVar6 = *(undefined8 **)(pMVar5 + 0x38);
    if (puVar27 != puVar6) {
      uVar32 = 0;
      do {
        lVar7 = *(long *)&this->hlg;
        __new_size = (**(code **)(*(long *)*puVar27 + 0x18))();
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)(uVar32 * 0x18 + lVar7),__new_size);
        puVar27 = puVar27 + 1;
        uVar32 = (ulong)((int)uVar32 + 1);
      } while (puVar27 != puVar6);
    }
    local_d8->shadow_params_allocated = true;
  }
  local_d0 = Trainer::clip_gradients(&local_d8->super_Trainer);
  pMVar5 = (local_d8->super_Trainer).model;
  p_Var25 = *(_Hash_node_base **)(pMVar5 + 0x18);
  local_c0 = *(_Hash_node_base **)(pMVar5 + 0x20);
  if (p_Var25 != local_c0) {
    uVar32 = 0;
    do {
      this_00 = (Parameters *)p_Var25->_M_nxt;
      uVar24 = (ulong)(this_00->values).d.nd;
      iVar22 = 1;
      iVar33 = 1;
      if (uVar24 != 0) {
        uVar26 = 0;
        do {
          iVar33 = iVar33 * (this_00->values).d.d[uVar26];
          uVar26 = uVar26 + 1;
        } while (uVar24 != uVar26);
      }
      uVar24 = (ulong)(this_00->g).d.nd;
      if (uVar24 != 0) {
        iVar22 = 1;
        uVar26 = 0;
        do {
          iVar22 = iVar22 * (this_00->g).d.d[uVar26];
          uVar26 = uVar26 + 1;
        } while (uVar24 != uVar26);
      }
      pfVar8 = (local_d8->hg).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar34 = iVar33 * (this_00->values).d.bd;
      pfVar9 = (this_00->values).v;
      local_b8 = ZEXT416((uint)(local_d8->super_Trainer).lambda);
      uVar23 = iVar22 * (this_00->g).d.bd;
      local_80 = (ulong)uVar23;
      local_88 = (this_00->g).v;
      if (uVar23 == 0) {
        fVar35 = 0.0;
      }
      else {
        local_68.
        super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
        .
        super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
        .m_d.argImpl.
        super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
        .
        super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
        .m_data = local_88;
        local_68.
        super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
        .
        super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
        .m_d.argImpl.
        super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
        .
        super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
        .m_outerStride.m_value = local_80;
        fVar35 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                           (&local_68,&local_d9,
                            (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                             *)&local_88);
      }
      fVar35 = (1.0 - local_d8->rho) * fVar35 + pfVar8[uVar32] * local_d8->rho;
      pfVar8[uVar32] = fVar35;
      fVar36 = (local_d8->super_Trainer).eta * local_cc;
      fVar35 = fVar35 + local_d8->epsilon;
      if (fVar35 < 0.0) {
        local_a8 = ZEXT416((uint)fVar36);
        fVar35 = sqrtf(fVar35);
        fVar36 = (float)local_a8._0_4_;
      }
      else {
        fVar35 = SQRT(fVar35);
      }
      pfVar10 = (this_00->g).v;
      uVar24 = (ulong)(this_00->g).d.nd;
      iVar22 = 1;
      if (uVar24 != 0) {
        uVar26 = 0;
        do {
          iVar22 = iVar22 * (this_00->g).d.d[uVar26];
          uVar26 = uVar26 + 1;
        } while (uVar24 != uVar26);
      }
      if (iVar22 * (this_00->g).d.bd != uVar34) {
LAB_0022397e:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>]"
                     );
      }
      uVar24 = (ulong)(this_00->values).d.nd;
      iVar22 = 1;
      if (uVar24 != 0) {
        uVar26 = 0;
        do {
          iVar22 = iVar22 * (this_00->values).d.d[uVar26];
          uVar26 = uVar26 + 1;
        } while (uVar24 != uVar26);
      }
      uVar23 = iVar22 * (this_00->values).d.bd;
      uVar24 = (ulong)uVar23;
      if (uVar23 != uVar34) {
LAB_0022395f:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::sub_assign_op<float, float>]"
                     );
      }
      pfVar11 = (this_00->values).v;
      uVar26 = uVar24;
      if ((((ulong)pfVar11 & 3) == 0) &&
         (uVar26 = (ulong)(-((uint)((ulong)pfVar11 >> 2) & 0x3fffffff) & 3), uVar24 <= uVar26)) {
        uVar26 = uVar24;
      }
      fVar35 = (fVar36 * local_d0) / fVar35;
      uVar29 = uVar24 - uVar26;
      uVar28 = uVar29 + 3;
      if (-1 < (long)uVar29) {
        uVar28 = uVar29;
      }
      if (uVar26 != 0) {
        uVar30 = 0;
        do {
          pfVar11[uVar30] =
               pfVar11[uVar30] - (pfVar9[uVar30] * (float)local_b8._0_4_ + pfVar10[uVar30] * fVar35)
          ;
          uVar30 = uVar30 + 1;
        } while (uVar26 != uVar30);
      }
      uVar28 = (uVar28 & 0xfffffffffffffffc) + uVar26;
      if (3 < (long)uVar29) {
        do {
          pfVar1 = pfVar10 + uVar26;
          fVar36 = pfVar1[1];
          fVar14 = pfVar1[2];
          fVar15 = pfVar1[3];
          pfVar2 = pfVar9 + uVar26;
          fVar16 = pfVar2[1];
          fVar17 = pfVar2[2];
          fVar18 = pfVar2[3];
          pfVar3 = pfVar11 + uVar26;
          fVar19 = pfVar3[1];
          fVar20 = pfVar3[2];
          fVar21 = pfVar3[3];
          pfVar4 = pfVar11 + uVar26;
          *pfVar4 = *pfVar3 - (*pfVar2 * (float)local_b8._0_4_ + *pfVar1 * fVar35);
          pfVar4[1] = fVar19 - (fVar16 * (float)local_b8._0_4_ + fVar36 * fVar35);
          pfVar4[2] = fVar20 - (fVar17 * (float)local_b8._0_4_ + fVar14 * fVar35);
          pfVar4[3] = fVar21 - (fVar18 * (float)local_b8._0_4_ + fVar15 * fVar35);
          uVar26 = uVar26 + 4;
        } while ((long)uVar26 < (long)uVar28);
      }
      if ((long)uVar28 < (long)uVar24) {
        do {
          pfVar11[uVar28] =
               pfVar11[uVar28] - (pfVar9[uVar28] * (float)local_b8._0_4_ + pfVar10[uVar28] * fVar35)
          ;
          uVar28 = uVar28 + 1;
        } while (uVar24 != uVar28);
      }
      uVar32 = (ulong)((int)uVar32 + 1);
      Parameters::clear(this_00);
      p_Var25 = p_Var25 + 1;
    } while (p_Var25 != local_c0);
  }
  pMVar5 = (local_d8->super_Trainer).model;
  local_90 = *(undefined8 **)(pMVar5 + 0x30);
  local_98 = *(undefined8 **)(pMVar5 + 0x38);
  if (local_90 != local_98) {
    local_c8 = 0;
    do {
      this_01 = (LookupParameters *)*local_90;
      p_Var25 = (this_01->non_zero_grads)._M_h._M_before_begin._M_nxt;
      if (p_Var25 != (_Hash_node_base *)0x0) {
        local_a8._0_8_ = (local_c8 & 0xffffffff) * 0x18 + *(long *)&local_d8->hlg;
        pRVar31 = local_d8;
        do {
          uVar32 = (ulong)*(uint *)&p_Var25[1]._M_nxt;
          pTVar12 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar24 = (ulong)pTVar12[uVar32].d.nd;
          iVar22 = 1;
          iVar33 = 1;
          if (uVar24 != 0) {
            uVar26 = 0;
            do {
              iVar33 = iVar33 * pTVar12[uVar32].d.d[uVar26];
              uVar26 = uVar26 + 1;
            } while (uVar24 != uVar26);
          }
          pTVar13 = (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar24 = (ulong)pTVar13[uVar32].d.nd;
          if (uVar24 != 0) {
            iVar22 = 1;
            uVar26 = 0;
            do {
              iVar22 = iVar22 * pTVar13[uVar32].d.d[uVar26];
              uVar26 = uVar26 + 1;
            } while (uVar24 != uVar26);
          }
          lVar7 = *(long *)local_a8._0_8_;
          uVar34 = iVar33 * pTVar12[uVar32].d.bd;
          pfVar9 = pTVar12[uVar32].v;
          local_b8 = ZEXT416((uint)(pRVar31->super_Trainer).lambda);
          uVar23 = iVar22 * pTVar13[uVar32].d.bd;
          local_80 = (ulong)uVar23;
          local_88 = pTVar13[uVar32].v;
          local_c0 = p_Var25;
          if (uVar23 == 0) {
            fVar35 = 0.0;
          }
          else {
            local_68.
            super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
            .
            super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
            .m_d.argImpl.
            super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
            .
            super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
            .m_data = local_88;
            local_68.
            super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
            .
            super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
            .m_d.argImpl.
            super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
            .
            super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
            .m_outerStride.m_value = local_80;
            fVar35 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                               (&local_68,&local_d9,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                                 *)&local_88);
            pRVar31 = local_d8;
          }
          fVar35 = (1.0 - pRVar31->rho) * fVar35 + *(float *)(lVar7 + uVar32 * 4) * pRVar31->rho;
          *(float *)(lVar7 + uVar32 * 4) = fVar35;
          fVar36 = (pRVar31->super_Trainer).eta * local_cc;
          fVar35 = fVar35 + pRVar31->epsilon;
          if (fVar35 < 0.0) {
            local_48 = ZEXT416((uint)fVar36);
            fVar35 = sqrtf(fVar35);
            pRVar31 = local_d8;
            fVar36 = (float)local_48._0_4_;
          }
          else {
            fVar35 = SQRT(fVar35);
          }
          pTVar12 = (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pfVar10 = pTVar12[uVar32].v;
          uVar24 = (ulong)pTVar12[uVar32].d.nd;
          iVar22 = 1;
          if (uVar24 != 0) {
            uVar26 = 0;
            do {
              iVar22 = iVar22 * pTVar12[uVar32].d.d[uVar26];
              uVar26 = uVar26 + 1;
            } while (uVar24 != uVar26);
          }
          if (iVar22 * pTVar12[uVar32].d.bd != uVar34) goto LAB_0022397e;
          pTVar12 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar24 = (ulong)pTVar12[uVar32].d.nd;
          iVar22 = 1;
          if (uVar24 != 0) {
            uVar26 = 0;
            do {
              iVar22 = iVar22 * pTVar12[uVar32].d.d[uVar26];
              uVar26 = uVar26 + 1;
            } while (uVar24 != uVar26);
          }
          uVar23 = iVar22 * pTVar12[uVar32].d.bd;
          uVar24 = (ulong)uVar23;
          if (uVar23 != uVar34) goto LAB_0022395f;
          pfVar11 = pTVar12[uVar32].v;
          uVar32 = uVar24;
          if ((((ulong)pfVar11 & 3) == 0) &&
             (uVar32 = (ulong)(-((uint)((ulong)pfVar11 >> 2) & 0x3fffffff) & 3), uVar24 <= uVar32))
          {
            uVar32 = uVar24;
          }
          fVar35 = (fVar36 * local_d0) / fVar35;
          uVar28 = uVar24 - uVar32;
          uVar26 = uVar28 + 3;
          if (-1 < (long)uVar28) {
            uVar26 = uVar28;
          }
          if (uVar32 != 0) {
            uVar29 = 0;
            do {
              pfVar11[uVar29] =
                   pfVar11[uVar29] -
                   (pfVar9[uVar29] * (float)local_b8._0_4_ + pfVar10[uVar29] * fVar35);
              uVar29 = uVar29 + 1;
            } while (uVar32 != uVar29);
          }
          uVar26 = (uVar26 & 0xfffffffffffffffc) + uVar32;
          if (3 < (long)uVar28) {
            do {
              pfVar1 = pfVar10 + uVar32;
              fVar36 = pfVar1[1];
              fVar14 = pfVar1[2];
              fVar15 = pfVar1[3];
              pfVar2 = pfVar9 + uVar32;
              fVar16 = pfVar2[1];
              fVar17 = pfVar2[2];
              fVar18 = pfVar2[3];
              pfVar3 = pfVar11 + uVar32;
              fVar19 = pfVar3[1];
              fVar20 = pfVar3[2];
              fVar21 = pfVar3[3];
              pfVar4 = pfVar11 + uVar32;
              *pfVar4 = *pfVar3 - (*pfVar2 * (float)local_b8._0_4_ + *pfVar1 * fVar35);
              pfVar4[1] = fVar19 - (fVar16 * (float)local_b8._0_4_ + fVar36 * fVar35);
              pfVar4[2] = fVar20 - (fVar17 * (float)local_b8._0_4_ + fVar14 * fVar35);
              pfVar4[3] = fVar21 - (fVar18 * (float)local_b8._0_4_ + fVar15 * fVar35);
              uVar32 = uVar32 + 4;
            } while ((long)uVar32 < (long)uVar26);
          }
          if ((long)uVar26 < (long)uVar24) {
            do {
              pfVar11[uVar26] =
                   pfVar11[uVar26] -
                   (pfVar9[uVar26] * (float)local_b8._0_4_ + pfVar10[uVar26] * fVar35);
              uVar26 = uVar26 + 1;
            } while (uVar24 != uVar26);
          }
          p_Var25 = local_c0->_M_nxt;
        } while (p_Var25 != (_Hash_node_base *)0x0);
      }
      local_c8 = (ulong)((int)local_c8 + 1);
      LookupParameters::clear(this_01);
      local_90 = local_90 + 1;
    } while (local_90 != local_98);
  }
  (local_d8->super_Trainer).updates = (local_d8->super_Trainer).updates + 1.0;
  return;
}

Assistant:

void RmsPropTrainer::update(real scale) {
  unsigned pi = 0;
  if (!shadow_params_allocated) {
    hg.resize(model->parameters_list().size());

    pi = 0;
    hlg.resize(model->lookup_parameters_list().size());
    for (auto p : model->lookup_parameters_list()) {
      hlg[pi++].resize(p->size());
    }

    shadow_params_allocated = true;
  }

  const float gscale = clip_gradients();
  pi = 0;
  for (auto p : model->parameters_list()) {
    real& d2 = hg[pi++];
    auto reg = p->values.vec() * lambda;
    real g2 = p->g.vec().squaredNorm();
    d2 = rho * d2 + (1.0 - rho) * g2;
    p->values.vec() -= ((eta * scale * gscale / sqrt(d2 + epsilon)) * p->g.vec() + reg);
    p->clear();
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<real>& hlgx = hlg[pi++];
    for (auto i : p->non_zero_grads) {
      real& d2 = hlgx[i];
      auto reg = p->values[i].vec() * lambda;
      real g2 = p->grads[i].vec().squaredNorm();
      d2 = rho * d2 + (1.0 - rho) * g2;
      p->values[i].vec() -= ((eta * scale * gscale / sqrt(d2 + epsilon)) * p->grads[i].vec() + reg);
    }
    p->clear();
  }
  ++updates;
}